

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O0

bool __thiscall
ZAP::ArchiveBuilder::build(ArchiveBuilder *this,ostream *stream,Compression compression)

{
  reference pEVar1;
  ostream *poVar2;
  bool bVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  size_type sVar6;
  ulong uVar7;
  FileList *pFVar8;
  long lVar9;
  streamoff sVar10;
  undefined1 auVar11 [16];
  fpos<__mbstate_t> local_328;
  fpos<__mbstate_t> local_318;
  uint local_304;
  undefined1 auStack_300 [4];
  uint32_t pos;
  undefined8 local_2f8;
  uint local_2ec;
  char *pcStack_2e8;
  uint32_t bpos;
  char *filedata;
  __mbstate_t local_2d8;
  undefined1 local_2d0 [2] [16];
  char local_2b0 [8];
  ifstream entryFile;
  uint32_t local_a8;
  uint local_a4;
  uint32_t archive_filesize;
  uint32_t original_filesize;
  undefined8 local_98;
  uint local_8c;
  reference pEStack_88;
  uint32_t index;
  Entry *entry_1;
  iterator __end1_1;
  iterator __begin1_1;
  FileList *__range1_1;
  undefined8 local_60;
  reference local_58;
  Entry *entry;
  iterator __end1;
  iterator __begin1;
  FileList *__range1;
  uint32_t *currFillIn;
  uint32_t *fillIn;
  uint32_t tableSize;
  Compression compression_local;
  ostream *stream_local;
  ArchiveBuilder *this_local;
  
  fillIn._4_4_ = compression;
  _tableSize = stream;
  stream_local = (ostream *)this;
  bVar3 = supportsCompression(compression);
  if (bVar3) {
    anon_unknown.dwarf_1b11c::writeField<unsigned_short>(_tableSize,0x415a);
    anon_unknown.dwarf_1b11c::writeField<unsigned_char>(_tableSize,'\0');
    anon_unknown.dwarf_1b11c::writeField<unsigned_char>(_tableSize,(uchar)fillIn._4_4_);
    sVar6 = std::
            set<ZAP::ArchiveBuilder::Entry,_std::less<ZAP::ArchiveBuilder::Entry>,_std::allocator<ZAP::ArchiveBuilder::Entry>_>
            ::size(&this->files);
    fillIn._0_4_ = (uint)sVar6;
    (anonymous_namespace)::writeField<unsigned_int*>(_tableSize,(uint *)&fillIn);
    uVar7 = SUB168(ZEXT416((uint)fillIn) * ZEXT816(4),0);
    if (SUB168(ZEXT416((uint)fillIn) * ZEXT816(4),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pFVar8 = (FileList *)operator_new__(uVar7);
    __end1 = std::
             set<ZAP::ArchiveBuilder::Entry,_std::less<ZAP::ArchiveBuilder::Entry>,_std::allocator<ZAP::ArchiveBuilder::Entry>_>
             ::begin(&this->files);
    entry = (Entry *)std::
                     set<ZAP::ArchiveBuilder::Entry,_std::less<ZAP::ArchiveBuilder::Entry>,_std::allocator<ZAP::ArchiveBuilder::Entry>_>
                     ::end(&this->files);
    __range1 = pFVar8;
    while (bVar3 = std::operator!=(&__end1,(_Self *)&entry), bVar3) {
      local_58 = std::_Rb_tree_const_iterator<ZAP::ArchiveBuilder::Entry>::operator*(&__end1);
      poVar2 = _tableSize;
      lVar9 = std::__cxx11::string::c_str();
      std::__cxx11::string::size();
      std::ostream::write((char *)poVar2,lVar9);
      auVar11 = std::ostream::tellp();
      local_60 = auVar11._8_8_;
      __range1_1 = auVar11._0_8_;
      sVar10 = std::fpos::operator_cast_to_long((fpos *)&__range1_1);
      *(int *)&(__range1->_M_t)._M_impl = (int)sVar10;
      anon_unknown.dwarf_1b11c::writeField<int>(_tableSize,0);
      anon_unknown.dwarf_1b11c::writeField<int>(_tableSize,0);
      anon_unknown.dwarf_1b11c::writeField<int>(_tableSize,0);
      __range1 = (FileList *)&(__range1->_M_t)._M_impl.field_0x4;
      std::_Rb_tree_const_iterator<ZAP::ArchiveBuilder::Entry>::operator++(&__end1);
    }
    __end1_1 = std::
               set<ZAP::ArchiveBuilder::Entry,_std::less<ZAP::ArchiveBuilder::Entry>,_std::allocator<ZAP::ArchiveBuilder::Entry>_>
               ::begin(&this->files);
    entry_1 = (Entry *)std::
                       set<ZAP::ArchiveBuilder::Entry,_std::less<ZAP::ArchiveBuilder::Entry>,_std::allocator<ZAP::ArchiveBuilder::Entry>_>
                       ::end(&this->files);
    __range1 = pFVar8;
    while( true ) {
      bVar3 = std::operator!=(&__end1_1,(_Self *)&entry_1);
      if (!bVar3) break;
      pEStack_88 = std::_Rb_tree_const_iterator<ZAP::ArchiveBuilder::Entry>::operator*(&__end1_1);
      auVar11 = std::ostream::tellp();
      _archive_filesize = auVar11;
      sVar10 = std::fpos::operator_cast_to_long((fpos *)&archive_filesize);
      pEVar1 = pEStack_88;
      local_8c = (uint)sVar10;
      local_a4 = 0;
      local_a8 = 0;
      _Var5 = std::operator|(_S_in,_S_bin);
      _Var5 = std::operator|(_Var5,_S_ate);
      std::ifstream::ifstream(local_2b0,(string *)pEVar1,_Var5);
      bVar4 = std::ifstream::is_open();
      if ((bVar4 & 1) != 0) {
        auVar11 = std::istream::tellg();
        local_2d0[0] = auVar11;
        sVar10 = std::fpos::operator_cast_to_long((fpos *)local_2d0);
        local_a4 = (uint)sVar10;
        std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&filedata,0);
        std::istream::seekg(local_2b0,filedata,local_2d8);
        pcStack_2e8 = (char *)operator_new__((ulong)local_a4);
        std::istream::read(local_2b0,(long)pcStack_2e8);
        bVar3 = compress(fillIn._4_4_,&stack0xfffffffffffffd18,local_a4,&local_a8);
        if (bVar3) {
          std::ostream::write((char *)_tableSize,(long)pcStack_2e8);
        }
        else {
          local_a4 = 0;
          local_a8 = 0;
        }
        if (pcStack_2e8 != (char *)0x0) {
          operator_delete__(pcStack_2e8);
        }
        pcStack_2e8 = (char *)0x0;
        std::ifstream::close();
      }
      auVar11 = std::ostream::tellp();
      _auStack_300 = auVar11;
      sVar10 = std::fpos::operator_cast_to_long((fpos *)auStack_300);
      poVar2 = _tableSize;
      local_2ec = (uint)sVar10;
      local_304 = *(uint *)&(__range1->_M_t)._M_impl;
      std::fpos<__mbstate_t>::fpos(&local_318,(ulong)local_304);
      std::ostream::seekp(poVar2,local_318._M_off,local_318._M_state);
      (anonymous_namespace)::writeField<unsigned_int*>(_tableSize,&local_8c);
      (anonymous_namespace)::writeField<unsigned_int*>(_tableSize,&local_a4);
      (anonymous_namespace)::writeField<unsigned_int*>(_tableSize,&local_a8);
      poVar2 = _tableSize;
      std::fpos<__mbstate_t>::fpos(&local_328,(ulong)local_2ec);
      std::ostream::seekp(poVar2,local_328._M_off,local_328._M_state);
      __range1 = (FileList *)&(__range1->_M_t)._M_impl.field_0x4;
      std::ifstream::~ifstream(local_2b0);
      std::_Rb_tree_const_iterator<ZAP::ArchiveBuilder::Entry>::operator++(&__end1_1);
    }
    if (pFVar8 != (FileList *)0x0) {
      operator_delete__(pFVar8);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ArchiveBuilder::build(std::ostream &stream, Compression compression)
	{
		if (!supportsCompression(compression))
		{
			return false;
		}

		// Header
		writeField(stream, MAGIC_CHARS); // Magic
		writeField(stream, static_cast<std::uint8_t>(Version::CURRENT)); // Version
		writeField(stream, static_cast<std::uint8_t>(compression)); // Compression

		// Build lookup table
		std::uint32_t tableSize = static_cast<std::uint32_t>(files.size());
		writeField(stream, &tableSize); // Table size

		std::uint32_t *fillIn = new std::uint32_t[tableSize];
		std::uint32_t *currFillIn = &fillIn[0];
		for (const Entry &entry : files)
		{
			stream.write(entry.virtual_path.c_str(), sizeof(char)*entry.virtual_path.size()+1);

			// We don't know these values yet
			(*currFillIn) = static_cast<std::uint32_t>(stream.tellp());
			writeField(stream, 0); // File index
			writeField(stream, 0); // Original file size
			writeField(stream, 0); // Archive file size

			++currFillIn;
		}
		currFillIn = &fillIn[0];

		// Build data block
		for (const Entry &entry : files)
		{
			std::uint32_t index = static_cast<std::uint32_t>(stream.tellp());
			std::uint32_t original_filesize = 0;
			std::uint32_t archive_filesize = 0;

			std::ifstream entryFile(entry.real_path, std::ios::in | std::ios::binary | std::ios::ate);
			if (entryFile.is_open())
			{
				original_filesize = static_cast<std::uint32_t>(entryFile.tellg());
				entryFile.seekg(0);

				// Write file data
				char *filedata = new char[original_filesize];
				entryFile.read(filedata, original_filesize);

				if (compress(compression, filedata, original_filesize, archive_filesize))
				{
					stream.write(filedata, archive_filesize);
				}
				else
				{
					original_filesize = 0;
					archive_filesize  = 0;
				}

				delete[] filedata;
				filedata = nullptr;

				entryFile.close();
			}

			// Fill in header
			std::uint32_t bpos = static_cast<std::uint32_t>(stream.tellp());
			std::uint32_t pos = (*currFillIn);
			stream.seekp(pos);

			writeField(stream, &index);
			writeField(stream, &original_filesize);
			writeField(stream, &archive_filesize);

			stream.seekp(bpos);

			++currFillIn;
		}

		delete[] fillIn;
		fillIn = nullptr;
		currFillIn = nullptr;

		return true;
	}